

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

AndConstraint * __thiscall icu_63::OrConstraint::add(OrConstraint *this,UErrorCode *status)

{
  AndConstraint *this_00;
  OrConstraint *pOVar1;
  
  if (this->fInternalStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    do {
      pOVar1 = this;
      this = pOVar1->next;
    } while (pOVar1->next != (OrConstraint *)0x0);
    this_00 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)status);
    if (this_00 != (AndConstraint *)0x0) {
      this_00->negated = '\0';
      this_00->integerOnly = '\0';
      *(undefined2 *)&this_00->field_0x22 = 0;
      this_00->digitsType = none;
      this_00->next = (AndConstraint *)0x0;
      *(undefined8 *)&this_00->value = 0;
      this_00->rangeList = (UVector32 *)0x0;
      this_00->_vptr_AndConstraint = (_func_int **)0x0;
      this_00->op = NONE;
      this_00->opNum = 0;
      *(undefined8 *)&this_00->fInternalStatus = 0;
      AndConstraint::AndConstraint(this_00);
      pOVar1->childNode = this_00;
      return this_00;
    }
    pOVar1->childNode = (AndConstraint *)0x0;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    *status = this->fInternalStatus;
  }
  return (AndConstraint *)0x0;
}

Assistant:

AndConstraint*
OrConstraint::add(UErrorCode& status) {
    if (U_FAILURE(fInternalStatus)) {
        status = fInternalStatus;
        return nullptr;
    }
    OrConstraint *curOrConstraint=this;
    {
        while (curOrConstraint->next!=nullptr) {
            curOrConstraint = curOrConstraint->next;
        }
        U_ASSERT(curOrConstraint->childNode == nullptr);
        curOrConstraint->childNode = new AndConstraint();
        if (curOrConstraint->childNode == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
    }
    return curOrConstraint->childNode;
}